

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnTable
          (BinaryReaderLogging *this,Index index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  char local_98 [8];
  char buf [100];
  Limits *elem_limits_local;
  Type elem_type_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  
  anon_unknown_21::SPrintLimits(local_98,100,elem_limits);
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = GetTypeName(elem_type);
  Stream::Writef(this_00,"OnTable(index: %u, elem_type: %s, %s)\n",(ulong)index,pcVar2,local_98);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x1c])
                    (this->reader_,(ulong)index,(ulong)(uint)elem_type,elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnTable(index: %" PRIindex ", elem_type: %s, %s)\n", index,
       GetTypeName(elem_type), buf);
  return reader_->OnTable(index, elem_type, elem_limits);
}